

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFindPackageCommand::AddFindDefinition(cmFindPackageCommand *this,string *var,char *val)

{
  char *pcVar1;
  char *__s;
  mapped_type *pmVar2;
  
  __s = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,var);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
           ::operator[](&this->OriginalDefs,var);
  if (__s == (char *)0x0) {
    pmVar2->exists = false;
  }
  else {
    pmVar2->exists = true;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
             ::operator[](&this->OriginalDefs,var);
    pcVar1 = (char *)(pmVar2->value)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&pmVar2->value,0,pcVar1,(ulong)__s);
  }
  cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,var,val);
  return;
}

Assistant:

void cmFindPackageCommand::AddFindDefinition(const std::string& var,
                                             const char* val)
{
  if(const char* old = this->Makefile->GetDefinition(var))
    {
    this->OriginalDefs[var].exists = true;
    this->OriginalDefs[var].value = old;
    }
  else
    {
    this->OriginalDefs[var].exists = false;
    }
  this->Makefile->AddDefinition(var, val);
}